

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstring.cpp
# Opt level: O0

void __thiscall FString::ReplaceChars(FString *this,char *oldcharset,char newchar)

{
  char *pcStack_18;
  char newchar_local;
  char *oldcharset_local;
  FString *this_local;
  
  if ((oldcharset != (char *)0x0) && (*oldcharset != '\0')) {
    pcStack_18 = oldcharset;
    oldcharset_local = (char *)this;
    ReplaceChars<FString::ReplaceChars(char_const*,char)::__0>
              (this,(anon_class_8_1_d6321303)&stack0xffffffffffffffe8,newchar);
  }
  return;
}

Assistant:

void FString::ReplaceChars (const char *oldcharset, char newchar)
{
	if (oldcharset == NULL || oldcharset[0] == '\0')
		return;

	ReplaceChars([&oldcharset](char c){ return strchr(oldcharset, c) != NULL; }, newchar);
}